

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConjugateGradient.cpp
# Opt level: O2

DynamicVector<double,_std::allocator<double>_> * __thiscall
QuantLib::ConjugateGradient::getUpdatedDirection
          (DynamicVector<double,_std::allocator<double>_> *__return_storage_ptr__,
          ConjugateGradient *this,Problem *P,RealType gold2,
          DynamicVector<double,_std::allocator<double>_> *param_3)

{
  _Vector_base<double,_std::allocator<double>_> local_48;
  _Vector_base<double,_std::allocator<double>_> local_30;
  
  OpenMD::operator-((DynamicVector<double,_std::allocator<double>_> *)&local_30,
                    (OpenMD *)&((this->super_LineSearchBasedMethod).lineSearch_)->gradient_,
                    (DynamicVector<double,_std::allocator<double>_> *)P);
  OpenMD::operator*((DynamicVector<double,_std::allocator<double>_> *)&local_48,
                    P->squaredNorm_ / gold2,
                    &((this->super_LineSearchBasedMethod).lineSearch_)->searchDirection_);
  OpenMD::operator+(__return_storage_ptr__,
                    (DynamicVector<double,_std::allocator<double>_> *)&local_30,
                    (DynamicVector<double,_std::allocator<double>_> *)&local_48);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_30);
  return __return_storage_ptr__;
}

Assistant:

DynamicVector<RealType> ConjugateGradient::getUpdatedDirection(
      const Problem& P, RealType gold2, const DynamicVector<RealType>&) {
    return -lineSearch_->lastGradient() +
           (P.gradientNormValue() / gold2) * lineSearch_->searchDirection();
  }